

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O0

ItemWrapper * __thiscall ItemWrapper::getItemName_abi_cxx11_(ItemWrapper *this)

{
  long in_RSI;
  ItemWrapper *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x38));
  return this;
}

Assistant:

std::string ItemWrapper::getItemName() {
    return itemName;
}